

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O1

bool __thiscall
Js::InlineCache::ConfirmCacheMiss(InlineCache *this,Type *oldType,PropertyValueInfo *info)

{
  bool bVar1;
  
  if (((this->u).local.type == oldType) || ((this->u).local.typeWithoutProperty == oldType)) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if ((info != (PropertyValueInfo *)0x0) && ((Type *)(this->u).proto.prototypeObject == oldType))
    {
      bVar1 = ((this->u).accessor.field_1.rawUInt16 >> 1 & 3) != (short)(char)info->flags;
    }
  }
  return bVar1;
}

Assistant:

bool InlineCache::ConfirmCacheMiss(const Type * oldType, const PropertyValueInfo* info) const
    {
        return u.local.type != oldType
            && u.proto.type != oldType
            && (u.accessor.type != oldType || info == NULL || u.accessor.flags != info->GetFlags());
    }